

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializerUnittest.cpp
# Opt level: O2

void __thiscall
SerializerUnittest_Initialization_Test::~SerializerUnittest_Initialization_Test
          (SerializerUnittest_Initialization_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SerializerUnittest, Initialization)
{
    // Create serializer
    std::string directory = "./";
    std::string prefix = "myprefix";
    Serializer& ser = *reinterpret_cast<Serializer*>(fs_create_serializer(
                directory.data(), directory.size(),
                prefix.data(), prefix.size(), 'w'));

    ASSERT_EQ(directory, ser.directory());
    ASSERT_EQ(prefix, ser.prefix());
    ASSERT_EQ(SerializerOpenModeWrite, ser.mode());

    ASSERT_EQ('w', fs_serializer_openmode(&ser));

    fs_destroy_serializer(&ser);
}